

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

Token * has_token_of_type(List *list,TokenType type)

{
  Token *pTVar1;
  
  if (list == (List *)0x0) {
    return (Token *)0x0;
  }
  while( true ) {
    if ((list->token).type == type) {
      return &list->token;
    }
    pTVar1 = has_token_of_type(list->car,type);
    if (pTVar1 != (Token *)0x0) break;
    list = list->cdr;
    if (list == (ListStruct *)0x0) {
      return (Token *)0x0;
    }
  }
  return pTVar1;
}

Assistant:

Token *
has_token_of_type (List *list, TokenType type)
{
  Token *t;

  if (list == NULL)
    return NULL;
  if (list->token.type == type)
    return &list->token;
  t = has_token_of_type (list->car, type);
  if (t != NULL)
    return t;
  t = has_token_of_type (list->cdr, type);
  if (t != NULL)
    return t;
  return NULL;
}